

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O0

TRef fold_simplify_intsubsub_leftcancel(jit_State *J)

{
  TRef TVar1;
  long in_RDI;
  jit_State *unaff_retaddr;
  int32_t in_stack_fffffffffffffffc;
  
  if ((*(byte *)(in_RDI + 0x9c) & 0x1f) != 0xe) {
    if ((*(byte *)(in_RDI + 0xa4) & 0x40) != 0) {
      return 0;
    }
    if (*(short *)(in_RDI + 0x9a) == *(short *)(in_RDI + 0xa0)) {
      TVar1 = lj_ir_kint(unaff_retaddr,in_stack_fffffffffffffffc);
      *(short *)(in_RDI + 0x98) = (short)TVar1;
      *(undefined2 *)(in_RDI + 0x9a) = *(undefined2 *)(in_RDI + 0xa2);
      return 1;
    }
  }
  return 0;
}

Assistant:

LJFOLD(SUB SUB any)
LJFOLDF(simplify_intsubsub_leftcancel)
{
  if (!irt_isnum(fins->t)) {
    PHIBARRIER(fleft);
    if (fins->op2 == fleft->op1) {  /* (i - j) - i ==> 0 - j */
      fins->op1 = (IRRef1)lj_ir_kint(J, 0);
      fins->op2 = fleft->op2;
      return RETRYFOLD;
    }
  }
  return NEXTFOLD;
}